

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_ecdsa_adaptor_sign_helper
              (secp256k1_scalar *sigs,secp256k1_scalar *message,secp256k1_scalar *k,secp256k1_ge *r,
              secp256k1_scalar *sk)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  uint uVar68;
  ulong uVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  int iVar73;
  ulong uVar74;
  ulong uVar75;
  ulong uVar76;
  ulong uVar77;
  ulong uVar78;
  ulong uVar79;
  ulong uVar80;
  ulong uVar81;
  ulong uVar82;
  ulong uVar83;
  ulong uVar84;
  ulong uVar85;
  ulong uVar86;
  ulong uVar87;
  ulong uVar88;
  ulong uVar89;
  undefined1 auVar90 [16];
  int overflow;
  secp256k1_scalar sigr;
  uchar b [32];
  secp256k1_scalar local_b8;
  secp256k1_scalar local_98;
  uint64_t local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  undefined1 local_48 [16];
  
  secp256k1_fe_normalize(&r->x);
  secp256k1_fe_get_b32((uchar *)&local_78,&r->x);
  secp256k1_scalar_set_b32(&local_98,(uchar *)&local_78,(int *)&local_b8);
  uVar68 = 0;
  if ((int)local_b8.d[0] == 0) {
    uVar70 = sk->d[0];
    uVar71 = sk->d[1];
    uVar74 = sk->d[2];
    uVar72 = sk->d[3];
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_98.d[0];
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar70;
    uVar75 = SUB168(auVar1 * auVar33,8);
    auVar66._8_8_ = 0;
    auVar66._0_8_ = uVar75;
    local_78 = SUB168(auVar1 * auVar33,0);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_98.d[0];
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar71;
    auVar2 = auVar2 * auVar34;
    uVar80 = SUB168(auVar2 + auVar66,0);
    uVar84 = SUB168(auVar2 + auVar66,8);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_98.d[1];
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar70;
    uVar76 = SUB168(auVar3 * auVar35,8);
    uVar69 = SUB168(auVar3 * auVar35,0);
    local_70 = uVar80 + uVar69;
    uVar69 = (ulong)CARRY8(uVar80,uVar69);
    uVar80 = uVar84 + uVar76;
    uVar85 = uVar80 + uVar69;
    uVar86 = (ulong)CARRY8(auVar2._8_8_,(ulong)CARRY8(uVar75,auVar2._0_8_)) +
             (ulong)(CARRY8(uVar84,uVar76) || CARRY8(uVar80,uVar69));
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_98.d[0];
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar74;
    uVar77 = SUB168(auVar4 * auVar36,8);
    uVar69 = SUB168(auVar4 * auVar36,0);
    uVar75 = uVar85 + uVar69;
    uVar69 = (ulong)CARRY8(uVar85,uVar69);
    uVar76 = uVar86 + uVar77;
    uVar87 = uVar76 + uVar69;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_98.d[1];
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar71;
    uVar78 = SUB168(auVar5 * auVar37,8);
    uVar80 = SUB168(auVar5 * auVar37,0);
    uVar85 = uVar75 + uVar80;
    uVar80 = (ulong)CARRY8(uVar75,uVar80);
    uVar84 = uVar87 + uVar78;
    uVar88 = uVar84 + uVar80;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_98.d[2];
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar70;
    uVar79 = SUB168(auVar6 * auVar38,8);
    uVar75 = SUB168(auVar6 * auVar38,0);
    local_68 = uVar85 + uVar75;
    uVar75 = (ulong)CARRY8(uVar85,uVar75);
    uVar85 = uVar88 + uVar79;
    uVar89 = uVar85 + uVar75;
    uVar88 = (ulong)(CARRY8(uVar86,uVar77) || CARRY8(uVar76,uVar69)) +
             (ulong)(CARRY8(uVar87,uVar78) || CARRY8(uVar84,uVar80)) +
             (ulong)(CARRY8(uVar88,uVar79) || CARRY8(uVar85,uVar75));
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_98.d[0];
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar72;
    uVar78 = SUB168(auVar7 * auVar39,8);
    uVar69 = SUB168(auVar7 * auVar39,0);
    uVar75 = uVar89 + uVar69;
    uVar69 = (ulong)CARRY8(uVar89,uVar69);
    uVar76 = uVar88 + uVar78;
    uVar89 = uVar76 + uVar69;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_98.d[1];
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar74;
    uVar79 = SUB168(auVar8 * auVar40,8);
    uVar80 = SUB168(auVar8 * auVar40,0);
    uVar85 = uVar75 + uVar80;
    uVar80 = (ulong)CARRY8(uVar75,uVar80);
    uVar84 = uVar89 + uVar79;
    uVar81 = uVar84 + uVar80;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_98.d[2];
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar71;
    uVar86 = SUB168(auVar9 * auVar41,8);
    uVar75 = SUB168(auVar9 * auVar41,0);
    uVar77 = uVar85 + uVar75;
    uVar75 = (ulong)CARRY8(uVar85,uVar75);
    uVar85 = uVar81 + uVar86;
    uVar82 = uVar85 + uVar75;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = local_98.d[3];
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar70;
    uVar87 = SUB168(auVar10 * auVar42,8);
    uVar70 = SUB168(auVar10 * auVar42,0);
    local_60 = uVar77 + uVar70;
    uVar70 = (ulong)CARRY8(uVar77,uVar70);
    uVar77 = uVar82 + uVar87;
    uVar83 = uVar77 + uVar70;
    uVar78 = (ulong)(CARRY8(uVar88,uVar78) || CARRY8(uVar76,uVar69)) +
             (ulong)(CARRY8(uVar89,uVar79) || CARRY8(uVar84,uVar80)) +
             (ulong)(CARRY8(uVar81,uVar86) || CARRY8(uVar85,uVar75)) +
             (ulong)(CARRY8(uVar82,uVar87) || CARRY8(uVar77,uVar70));
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_98.d[1];
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar72;
    uVar84 = SUB168(auVar11 * auVar43,8);
    uVar70 = SUB168(auVar11 * auVar43,0);
    uVar75 = uVar83 + uVar70;
    uVar70 = (ulong)CARRY8(uVar83,uVar70);
    uVar80 = uVar78 + uVar84;
    uVar79 = uVar80 + uVar70;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = local_98.d[2];
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uVar74;
    uVar85 = SUB168(auVar12 * auVar44,8);
    uVar69 = SUB168(auVar12 * auVar44,0);
    uVar76 = uVar75 + uVar69;
    uVar69 = (ulong)CARRY8(uVar75,uVar69);
    uVar75 = uVar79 + uVar85;
    uVar86 = uVar75 + uVar69;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = local_98.d[3];
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar71;
    uVar77 = SUB168(auVar13 * auVar45,8);
    uVar71 = SUB168(auVar13 * auVar45,0);
    local_58 = uVar76 + uVar71;
    uVar71 = (ulong)CARRY8(uVar76,uVar71);
    uVar76 = uVar86 + uVar77;
    uVar87 = uVar76 + uVar71;
    uVar84 = (ulong)(CARRY8(uVar78,uVar84) || CARRY8(uVar80,uVar70)) +
             (ulong)(CARRY8(uVar79,uVar85) || CARRY8(uVar75,uVar69)) +
             (ulong)(CARRY8(uVar86,uVar77) || CARRY8(uVar76,uVar71));
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_98.d[2];
    auVar46._8_8_ = 0;
    auVar46._0_8_ = uVar72;
    uVar80 = SUB168(auVar14 * auVar46,8);
    uVar70 = SUB168(auVar14 * auVar46,0);
    uVar76 = uVar87 + uVar70;
    uVar70 = (ulong)CARRY8(uVar87,uVar70);
    uVar69 = uVar84 + uVar80;
    uVar85 = uVar69 + uVar70;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = local_98.d[3];
    auVar47._8_8_ = 0;
    auVar47._0_8_ = uVar74;
    uVar75 = SUB168(auVar15 * auVar47,8);
    uVar71 = SUB168(auVar15 * auVar47,0);
    local_50 = uVar76 + uVar71;
    uVar71 = (ulong)CARRY8(uVar76,uVar71);
    uVar74 = uVar85 + uVar75;
    local_48._8_8_ =
         (ulong)(CARRY8(uVar84,uVar80) || CARRY8(uVar69,uVar70)) +
         (ulong)(CARRY8(uVar85,uVar75) || CARRY8(uVar74,uVar71));
    local_48._0_8_ = uVar74 + uVar71;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = local_98.d[3];
    auVar48._8_8_ = 0;
    auVar48._0_8_ = uVar72;
    local_48 = auVar16 * auVar48 + local_48;
    secp256k1_scalar_reduce_512(&local_b8,&local_78);
    secp256k1_scalar_add(&local_b8,&local_b8,message);
    secp256k1_scalar_inverse(sigs,k);
    uVar70 = sigs->d[0];
    uVar71 = sigs->d[1];
    uVar74 = sigs->d[2];
    uVar77 = CONCAT44(local_b8.d[0]._4_4_,(int)local_b8.d[0]);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar70;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = uVar77;
    uVar80 = SUB168(auVar17 * auVar49,8);
    auVar67._8_8_ = 0;
    auVar67._0_8_ = uVar80;
    local_78 = SUB168(auVar17 * auVar49,0);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar70;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = local_b8.d[1];
    auVar18 = auVar18 * auVar50;
    uVar69 = SUB168(auVar18 + auVar67,0);
    uVar76 = SUB168(auVar18 + auVar67,8);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar71;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = uVar77;
    uVar75 = SUB168(auVar19 * auVar51,8);
    uVar72 = SUB168(auVar19 * auVar51,0);
    local_70 = uVar69 + uVar72;
    uVar72 = (ulong)CARRY8(uVar69,uVar72);
    uVar69 = uVar76 + uVar75;
    uVar84 = uVar69 + uVar72;
    uVar86 = (ulong)CARRY8(auVar18._8_8_,(ulong)CARRY8(uVar80,auVar18._0_8_)) +
             (ulong)(CARRY8(uVar76,uVar75) || CARRY8(uVar69,uVar72));
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar70;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = local_b8.d[2];
    uVar85 = SUB168(auVar20 * auVar52,8);
    uVar72 = SUB168(auVar20 * auVar52,0);
    uVar80 = uVar84 + uVar72;
    uVar72 = (ulong)CARRY8(uVar84,uVar72);
    uVar75 = uVar86 + uVar85;
    uVar87 = uVar75 + uVar72;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar71;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = local_b8.d[1];
    uVar78 = SUB168(auVar21 * auVar53,8);
    uVar69 = SUB168(auVar21 * auVar53,0);
    uVar84 = uVar80 + uVar69;
    uVar69 = (ulong)CARRY8(uVar80,uVar69);
    uVar76 = uVar87 + uVar78;
    uVar88 = uVar76 + uVar69;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar74;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = uVar77;
    uVar79 = SUB168(auVar22 * auVar54,8);
    uVar80 = SUB168(auVar22 * auVar54,0);
    local_68 = uVar84 + uVar80;
    uVar80 = (ulong)CARRY8(uVar84,uVar80);
    uVar84 = uVar88 + uVar79;
    uVar89 = uVar84 + uVar80;
    uVar88 = (ulong)(CARRY8(uVar86,uVar85) || CARRY8(uVar75,uVar72)) +
             (ulong)(CARRY8(uVar87,uVar78) || CARRY8(uVar76,uVar69)) +
             (ulong)(CARRY8(uVar88,uVar79) || CARRY8(uVar84,uVar80));
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar70;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = local_b8.d[3];
    uVar78 = SUB168(auVar23 * auVar55,8);
    uVar70 = SUB168(auVar23 * auVar55,0);
    uVar80 = uVar89 + uVar70;
    uVar72 = (ulong)CARRY8(uVar89,uVar70);
    uVar76 = uVar88 + uVar78;
    uVar89 = uVar76 + uVar72;
    uVar70 = sigs->d[3];
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar71;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = local_b8.d[2];
    uVar79 = SUB168(auVar24 * auVar56,8);
    uVar69 = SUB168(auVar24 * auVar56,0);
    uVar75 = uVar80 + uVar69;
    uVar69 = (ulong)CARRY8(uVar80,uVar69);
    uVar84 = uVar89 + uVar79;
    uVar81 = uVar84 + uVar69;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar74;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = local_b8.d[1];
    uVar86 = SUB168(auVar25 * auVar57,8);
    uVar80 = SUB168(auVar25 * auVar57,0);
    uVar83 = uVar75 + uVar80;
    uVar80 = (ulong)CARRY8(uVar75,uVar80);
    uVar85 = uVar81 + uVar86;
    uVar82 = uVar85 + uVar80;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar70;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = uVar77;
    uVar87 = SUB168(auVar26 * auVar58,8);
    uVar75 = SUB168(auVar26 * auVar58,0);
    local_60 = uVar83 + uVar75;
    uVar75 = (ulong)CARRY8(uVar83,uVar75);
    uVar77 = uVar82 + uVar87;
    uVar83 = uVar77 + uVar75;
    uVar78 = (ulong)(CARRY8(uVar88,uVar78) || CARRY8(uVar76,uVar72)) +
             (ulong)(CARRY8(uVar89,uVar79) || CARRY8(uVar84,uVar69)) +
             (ulong)(CARRY8(uVar81,uVar86) || CARRY8(uVar85,uVar80)) +
             (ulong)(CARRY8(uVar82,uVar87) || CARRY8(uVar77,uVar75));
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar71;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = local_b8.d[3];
    uVar84 = SUB168(auVar27 * auVar59,8);
    uVar71 = SUB168(auVar27 * auVar59,0);
    uVar69 = uVar83 + uVar71;
    uVar71 = (ulong)CARRY8(uVar83,uVar71);
    uVar80 = uVar78 + uVar84;
    uVar79 = uVar80 + uVar71;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar74;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = local_b8.d[2];
    uVar85 = SUB168(auVar28 * auVar60,8);
    uVar72 = SUB168(auVar28 * auVar60,0);
    uVar76 = uVar69 + uVar72;
    uVar72 = (ulong)CARRY8(uVar69,uVar72);
    uVar75 = uVar79 + uVar85;
    uVar86 = uVar75 + uVar72;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar70;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = local_b8.d[1];
    uVar77 = SUB168(auVar29 * auVar61,8);
    uVar69 = SUB168(auVar29 * auVar61,0);
    local_58 = uVar76 + uVar69;
    uVar69 = (ulong)CARRY8(uVar76,uVar69);
    uVar76 = uVar86 + uVar77;
    uVar87 = uVar76 + uVar69;
    uVar84 = (ulong)(CARRY8(uVar78,uVar84) || CARRY8(uVar80,uVar71)) +
             (ulong)(CARRY8(uVar79,uVar85) || CARRY8(uVar75,uVar72)) +
             (ulong)(CARRY8(uVar86,uVar77) || CARRY8(uVar76,uVar69));
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar74;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = local_b8.d[3];
    uVar75 = SUB168(auVar30 * auVar62,8);
    uVar71 = SUB168(auVar30 * auVar62,0);
    uVar80 = uVar87 + uVar71;
    uVar71 = (ulong)CARRY8(uVar87,uVar71);
    uVar69 = uVar84 + uVar75;
    uVar85 = uVar69 + uVar71;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar70;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = local_b8.d[2];
    uVar76 = SUB168(auVar31 * auVar63,8);
    uVar72 = SUB168(auVar31 * auVar63,0);
    local_50 = uVar80 + uVar72;
    uVar72 = (ulong)CARRY8(uVar80,uVar72);
    uVar80 = uVar85 + uVar76;
    auVar65._8_8_ =
         (ulong)(CARRY8(uVar84,uVar75) || CARRY8(uVar69,uVar71)) +
         (ulong)(CARRY8(uVar85,uVar76) || CARRY8(uVar80,uVar72));
    auVar65._0_8_ = uVar80 + uVar72;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar70;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = local_b8.d[3];
    local_48 = auVar32 * auVar64 + auVar65;
    secp256k1_scalar_reduce_512(sigs,&local_78);
    auVar90._0_4_ = -(uint)((int)sigs->d[2] == 0 && (int)sigs->d[0] == 0);
    auVar90._4_4_ = -(uint)(*(int *)((long)sigs->d + 0x14) == 0 && *(int *)((long)sigs->d + 4) == 0)
    ;
    auVar90._8_4_ = -(uint)((int)sigs->d[3] == 0 && (int)sigs->d[1] == 0);
    auVar90._12_4_ =
         -(uint)(*(int *)((long)sigs->d + 0x1c) == 0 && *(int *)((long)sigs->d + 0xc) == 0);
    iVar73 = movmskps((int)uVar74,auVar90);
    uVar68 = (uint)(iVar73 != 0xf);
  }
  return uVar68;
}

Assistant:

int secp256k1_ecdsa_adaptor_sign_helper(secp256k1_scalar *sigs, secp256k1_scalar *message, secp256k1_scalar *k, secp256k1_ge *r, secp256k1_scalar *sk) {
    secp256k1_scalar sigr;
    secp256k1_scalar n;

    secp256k1_fe_normalize(&r->x);
    if (!secp256k1_ecdsa_adaptor_fe_to_scalar(&sigr, &r->x)) {
        return 0;
    }
    secp256k1_scalar_mul(&n, &sigr, sk);
    secp256k1_scalar_add(&n, &n, message);
    secp256k1_scalar_inverse(sigs, k);
    secp256k1_scalar_mul(sigs, sigs, &n);

    secp256k1_scalar_clear(&n);
    return !secp256k1_scalar_is_zero(sigs);
}